

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
anon_unknown.dwarf_10abf14::EffectiveWidthVisitor::visit<slang::ast::BinaryExpression>
          (EffectiveWidthVisitor *this,BinaryExpression *expr)

{
  bool bVar1;
  Expression *in_stack_ffffffffffffffe0;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffff8;
  
  bVar1 = slang::ast::Expression::bad(in_stack_ffffffffffffffe0);
  if (bVar1) {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&stack0xfffffffffffffff8);
  }
  else {
    in_stack_fffffffffffffff8 =
         (_Optional_payload_base<unsigned_int>)
         slang::ast::BinaryExpression::getEffectiveWidthImpl
                   ((BinaryExpression *)in_stack_fffffffffffffff8);
  }
  return (optional<unsigned_int>)in_stack_fffffffffffffff8;
}

Assistant:

std::optional<bitwidth_t> visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveWidthImpl(); }) {
            if (expr.bad())
                return std::nullopt;

            return expr.getEffectiveWidthImpl();
        }
        else {
            return expr.type->getBitWidth();
        }
    }